

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O1

void __thiscall HN::State::forceUpdate(State *this,ItemIds *toUpdate)

{
  ItemContainer *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint64_t uVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  int *piVar7;
  int *piVar8;
  int id;
  int local_3c;
  int *local_38;
  
  uVar3 = t_s();
  piVar8 = (toUpdate->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar7 = (toUpdate->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar8 != piVar7) {
    this_00 = &this->items;
    p_Var1 = &(this->items)._M_t._M_impl.super__Rb_tree_header;
    local_38 = piVar7;
    do {
      local_3c = *piVar8;
      p_Var2 = (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < local_3c]) {
        if (local_3c <= (int)*(size_t *)(p_Var2 + 1)) {
          p_Var5 = p_Var2;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var5,
         local_3c < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      if ((p_Var6 != p_Var1) &&
         (pmVar4 = std::
                   map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                   ::operator[](this_00,&local_3c), 0x3c < uVar3 - pmVar4->lastForceUpdate_s)) {
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,&local_3c);
        pmVar4->needUpdate = true;
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,&local_3c);
        piVar7 = local_38;
        pmVar4->needRequest = true;
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,&local_3c);
        pmVar4->lastForceUpdate_s = uVar3;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar7);
  }
  return;
}

Assistant:

void State::forceUpdate(const ItemIds & toUpdate) {
        auto tNow_s = t_s();
        for (auto id : toUpdate) {
            if (items.find(id) == items.end()) continue;
            if (tNow_s - items[id].lastForceUpdate_s > 60) {
                items[id].needUpdate = true;
                items[id].needRequest = true;

                items[id].lastForceUpdate_s = tNow_s;
            }
        }
    }